

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereIndexExprTrans(Index *pIdx,int iTabCur,int iIdxCur,WhereInfo *pWInfo)

{
  short sVar1;
  ExprList *pEVar2;
  Table *pTVar3;
  int iVar4;
  char *zLeft;
  i16 iRef;
  IdxExprTrans x;
  Walker w;
  Table *pTab;
  ExprList *aColExpr;
  int iIdxCol;
  WhereInfo *pWInfo_local;
  int iIdxCur_local;
  int iTabCur_local;
  Index *pIdx_local;
  
  pEVar2 = pIdx->aColExpr;
  if ((pEVar2 != (ExprList *)0x0) || ((*(ushort *)&pIdx->field_0x63 >> 10 & 1) != 0)) {
    pTVar3 = pIdx->pTable;
    memset(&x.db,0,0x30);
    x.pWInfo = (WhereInfo *)pWInfo->pParse->db;
    x.pIdxExpr._0_4_ = iTabCur;
    x.pIdxExpr._4_4_ = iIdxCur;
    x._16_8_ = pWInfo;
    for (aColExpr._4_4_ = 0; aColExpr._4_4_ < (int)(uint)pIdx->nColumn;
        aColExpr._4_4_ = aColExpr._4_4_ + 1) {
      sVar1 = pIdx->aiColumn[aColExpr._4_4_];
      if (sVar1 == -2) {
        iVar4 = sqlite3ExprIsConstant(pEVar2->a[aColExpr._4_4_].pExpr);
        if (iVar4 == 0) {
LAB_001c3f65:
          x.iTabCur = aColExpr._4_4_;
          sqlite3WalkExpr((Walker *)&x.db,pWInfo->pWhere);
          sqlite3WalkExprList((Walker *)&x.db,pWInfo->pOrderBy);
          sqlite3WalkExprList((Walker *)&x.db,pWInfo->pResultSet);
        }
      }
      else if ((-1 < sVar1) && ((pTVar3->aCol[sVar1].colFlags & 0x20) != 0)) {
        if ((pTVar3->aCol[sVar1].colFlags & 0x200) != 0) {
          zLeft = sqlite3ColumnColl(pTVar3->aCol + sVar1);
          iVar4 = sqlite3StrICmp(zLeft,"BINARY");
          if (iVar4 != 0) goto LAB_001c3f9e;
        }
        x.iIdxCur = (int)sVar1;
        goto LAB_001c3f65;
      }
LAB_001c3f9e:
    }
  }
  return;
}

Assistant:

static void whereIndexExprTrans(
  Index *pIdx,      /* The Index */
  int iTabCur,      /* Cursor of the table that is being indexed */
  int iIdxCur,      /* Cursor of the index itself */
  WhereInfo *pWInfo /* Transform expressions in this WHERE clause */
){
  int iIdxCol;               /* Column number of the index */
  ExprList *aColExpr;        /* Expressions that are indexed */
  Table *pTab;
  Walker w;
  IdxExprTrans x;
  aColExpr = pIdx->aColExpr;
  if( aColExpr==0 && !pIdx->bHasVCol ){
    /* The index does not reference any expressions or virtual columns
    ** so no translations are needed. */
    return;
  }
  pTab = pIdx->pTable;
  memset(&w, 0, sizeof(w));
  w.u.pIdxTrans = &x;
  x.iTabCur = iTabCur;
  x.iIdxCur = iIdxCur;
  x.pWInfo = pWInfo;
  x.db = pWInfo->pParse->db;
  for(iIdxCol=0; iIdxCol<pIdx->nColumn; iIdxCol++){
    i16 iRef = pIdx->aiColumn[iIdxCol];
    if( iRef==XN_EXPR ){
      assert( aColExpr!=0 && aColExpr->a[iIdxCol].pExpr!=0 );
      x.pIdxExpr = aColExpr->a[iIdxCol].pExpr;
      if( sqlite3ExprIsConstant(x.pIdxExpr) ) continue;
      w.xExprCallback = whereIndexExprTransNode;
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( iRef>=0
       && (pTab->aCol[iRef].colFlags & COLFLAG_VIRTUAL)!=0
       && ((pTab->aCol[iRef].colFlags & COLFLAG_HASCOLL)==0
           || sqlite3StrICmp(sqlite3ColumnColl(&pTab->aCol[iRef]),
                                               sqlite3StrBINARY)==0)
    ){
      /* Check to see if there are direct references to generated columns
      ** that are contained in the index.  Pulling the generated column
      ** out of the index is an optimization only - the main table is always
      ** available if the index cannot be used.  To avoid unnecessary
      ** complication, omit this optimization if the collating sequence for
      ** the column is non-standard */
      x.iTabCol = iRef;
      w.xExprCallback = whereIndexExprTransColumn;
#endif /* SQLITE_OMIT_GENERATED_COLUMNS */
    }else{
      continue;
    }
    x.iIdxCol = iIdxCol;
    sqlite3WalkExpr(&w, pWInfo->pWhere);
    sqlite3WalkExprList(&w, pWInfo->pOrderBy);
    sqlite3WalkExprList(&w, pWInfo->pResultSet);
  }
}